

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct>::
ConvertToStruct(JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct> *this)

{
  bool bVar1;
  vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *in_RSI;
  DecodePsbtOutputStruct *in_RDI;
  DecodePsbtOutputStruct data;
  DecodePsbtOutput *element;
  const_iterator __end0;
  const_iterator __begin0;
  JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct> *__range3;
  vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *result;
  vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
  *in_stack_fffffffffffffe18;
  DecodePsbtOutputStruct *__x;
  DecodePsbtOutput *in_stack_ffffffffffffffb8;
  __normal_iterator<const_cfd::api::json::DecodePsbtOutput_*,_std::vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>_>
  local_28 [2];
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  ::std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>::vector
            ((vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *)0x6c06ce);
  local_28[0]._M_current =
       (DecodePsbtOutput *)
       ::std::
       vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>::
       begin(in_stack_fffffffffffffe18);
  ::std::vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>
  ::end(in_stack_fffffffffffffe18);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::api::json::DecodePsbtOutput_*,_std::vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_cfd::api::json::DecodePsbtOutput_*,_std::vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>_>
                             *)in_stack_fffffffffffffe18), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::DecodePsbtOutput_*,_std::vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>_>
    ::operator*(local_28);
    cfd::api::json::DecodePsbtOutput::ConvertToStruct(in_stack_ffffffffffffffb8);
    ::std::vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_>::push_back
              (in_RSI,__x);
    DecodePsbtOutputStruct::~DecodePsbtOutputStruct(in_RDI);
    __gnu_cxx::
    __normal_iterator<const_cfd::api::json::DecodePsbtOutput_*,_std::vector<cfd::api::json::DecodePsbtOutput,_std::allocator<cfd::api::json::DecodePsbtOutput>_>_>
    ::operator++(local_28);
  }
  return (vector<DecodePsbtOutputStruct,_std::allocator<DecodePsbtOutputStruct>_> *)__x;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }